

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2992::SingleEvaluationTest_WriteTests_Test::TestBody
          (SingleEvaluationTest_WriteTests_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  string gtest_output_1;
  OutputRedirect gtest_redir_1;
  string gtest_expected_output_1;
  AssertionResult gtest_ar_3;
  ScopedFakeTestPartResultReporter gtest_reporter;
  SingleFailureChecker gtest_checker;
  TestPartResultArray gtest_failures;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  string gtest_output;
  OutputRedirect gtest_redir;
  string gtest_expected_output;
  AssertionResult gtest_ar;
  OutputRedirect *in_stack_00000d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  TestPartResultArray *in_stack_fffffffffffffd18;
  SingleFailureChecker *in_stack_fffffffffffffd20;
  AssertionResult *in_stack_fffffffffffffd28;
  int line;
  ScopedFakeTestPartResultReporter *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  Type type;
  SingleFailureChecker *in_stack_fffffffffffffd40;
  AssertionResult *in_stack_fffffffffffffd88;
  AssertionResult *in_stack_fffffffffffffd90;
  AssertionResult local_228 [2];
  undefined4 local_204;
  AssertionResult local_200 [2];
  string local_1e0 [55];
  allocator local_1a9;
  string local_1a8 [32];
  AssertionResult local_188 [3];
  allocator local_151;
  string local_150 [124];
  undefined4 local_d4;
  AssertionResult local_d0 [2];
  undefined4 local_ac;
  AssertionResult local_a8 [2];
  int local_84;
  string local_80 [71];
  allocator local_39;
  string local_38 [32];
  AssertionResult local_18;
  
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    (anonymous_namespace)::SingleEvaluationTest::b_ =
         (anonymous_namespace)::SingleEvaluationTest::b_ + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"test",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    OutputRedirect::OutputRedirect
              ((OutputRedirect *)in_stack_fffffffffffffd40,(FILE *)in_stack_fffffffffffffd38);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (anonymous_namespace)::SingleEvaluationTest::a_ =
           (anonymous_namespace)::SingleEvaluationTest::a_ + 1;
      printf("test");
    }
    OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000d48);
    bVar1 = std::operator!=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    if (bVar1) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffd40,
                 (char (*) [59])in_stack_fffffffffffffd38);
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffd40,
                 (char (*) [11])in_stack_fffffffffffffd38);
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd90 =
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffd40,
                      (char (*) [2])in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd88 =
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffd40,
                      (char (*) [11])in_stack_fffffffffffffd38);
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_84 = 2;
    }
    else {
      local_84 = 0;
    }
    std::__cxx11::string::~string(local_80);
    OutputRedirect::~OutputRedirect((OutputRedirect *)in_stack_fffffffffffffd20);
    std::__cxx11::string::~string(local_38);
    if (local_84 == 0) goto LAB_00113bc0;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffd40);
  testing::AssertionResult::failure_message((AssertionResult *)0x113b02);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffd40,
             (Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),(char *)in_stack_fffffffffffffd30,
             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
  testing::Message::~Message((Message *)0x113b5f);
LAB_00113bc0:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113bcd);
  local_ac = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
             (int *)in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::AssertionResult::failure_message((AssertionResult *)0x113c48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd40,
               (Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),(char *)in_stack_fffffffffffffd30,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    testing::Message::~Message((Message *)0x113ca5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113d13);
  local_d4 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
             (int *)in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    testing::AssertionResult::failure_message((AssertionResult *)0x113d8e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd40,
               (Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),(char *)in_stack_fffffffffffffd30,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    testing::Message::~Message((Message *)0x113deb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113e5c);
  do {
    testing::TestPartResultArray::TestPartResultArray((TestPartResultArray *)0x113e69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"Actual: test",&local_151);
    testing::internal::SingleFailureChecker::SingleFailureChecker
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (Type)((ulong)in_stack_fffffffffffffd10 >> 0x20),in_stack_fffffffffffffd08);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    testing::ScopedFakeTestPartResultReporter::ScopedFakeTestPartResultReporter
              (in_stack_fffffffffffffd30,(InterceptMode)((ulong)in_stack_fffffffffffffd28 >> 0x20),
               (TestPartResultArray *)in_stack_fffffffffffffd20);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::AssertionSuccess();
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
      if (bVar1) {
        (anonymous_namespace)::SingleEvaluationTest::b_ =
             (anonymous_namespace)::SingleEvaluationTest::b_ + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a8,"other",&local_1a9);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
        OutputRedirect::OutputRedirect
                  ((OutputRedirect *)in_stack_fffffffffffffd40,(FILE *)in_stack_fffffffffffffd38);
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          (anonymous_namespace)::SingleEvaluationTest::a_ =
               (anonymous_namespace)::SingleEvaluationTest::a_ + 1;
          printf("test");
        }
        OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000d48);
        bVar1 = std::operator!=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        if (bVar1) {
          testing::AssertionResult::operator<<
                    ((AssertionResult *)in_stack_fffffffffffffd40,
                     (char (*) [59])in_stack_fffffffffffffd38);
          in_stack_fffffffffffffd40 =
               (SingleFailureChecker *)
               testing::AssertionResult::operator<<
                         ((AssertionResult *)in_stack_fffffffffffffd40,
                          (char (*) [11])in_stack_fffffffffffffd38);
          in_stack_fffffffffffffd38 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               testing::AssertionResult::operator<<
                         ((AssertionResult *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          in_stack_fffffffffffffd30 =
               (ScopedFakeTestPartResultReporter *)
               testing::AssertionResult::operator<<
                         ((AssertionResult *)in_stack_fffffffffffffd40,
                          (char (*) [2])in_stack_fffffffffffffd38);
          in_stack_fffffffffffffd28 =
               testing::AssertionResult::operator<<
                         ((AssertionResult *)in_stack_fffffffffffffd40,
                          (char (*) [11])in_stack_fffffffffffffd38);
          testing::AssertionResult::operator<<
                    ((AssertionResult *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          local_84 = 5;
        }
        else {
          local_84 = 0;
        }
        std::__cxx11::string::~string(local_1e0);
        OutputRedirect::~OutputRedirect((OutputRedirect *)in_stack_fffffffffffffd20);
        std::__cxx11::string::~string(local_1a8);
        if (local_84 != 0) goto LAB_00114207;
      }
      else {
LAB_00114207:
        testing::Message::Message((Message *)in_stack_fffffffffffffd40);
        in_stack_fffffffffffffd20 =
             (SingleFailureChecker *)
             testing::AssertionResult::failure_message((AssertionResult *)0x114223);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffd40,
                   (Type)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                   (char *)in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd20);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
        testing::Message::~Message((Message *)0x114280);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1142eb);
    }
    testing::ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter
              ((ScopedFakeTestPartResultReporter *)in_stack_fffffffffffffd20);
    testing::internal::SingleFailureChecker::~SingleFailureChecker(in_stack_fffffffffffffd40);
    testing::TestPartResultArray::~TestPartResultArray((TestPartResultArray *)0x114326);
    bVar1 = testing::internal::AlwaysFalse();
    if (!bVar1) {
      local_204 = 2;
      testing::internal::EqHelper<false>::Compare<int,int>
                (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
                 (int *)in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
      type = (Type)((ulong)in_stack_fffffffffffffd38 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd40);
        in_stack_fffffffffffffd18 =
             (TestPartResultArray *)
             testing::AssertionResult::failure_message((AssertionResult *)0x1143c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffd40,type,(char *)in_stack_fffffffffffffd30,
                   (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),(char *)in_stack_fffffffffffffd20
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
        testing::Message::~Message((Message *)0x114425);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x114493);
      testing::internal::EqHelper<false>::Compare<int,int>
                (&in_stack_fffffffffffffd28->success_,(char *)in_stack_fffffffffffffd20,
                 (int *)in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
      line = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_228);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd40);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x11450e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffd40,type,(char *)in_stack_fffffffffffffd30,
                   line,(char *)in_stack_fffffffffffffd20);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffd90,(Message *)in_stack_fffffffffffffd88);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x11456b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1145d6);
      return;
    }
  } while( true );
}

Assistant:

TEST_F(SingleEvaluationTest, WriteTests) {
  // successful EXPECT_WRITE
  EXPECT_WRITE(stdout, {  // NOLINT
    a_++;
    std::printf("test");
  }, (b_++, "test"));
  EXPECT_EQ(1, a_);
  EXPECT_EQ(1, b_);

  // failed EXPECT_WRITE
  EXPECT_NONFATAL_FAILURE(EXPECT_WRITE(stdout, {  // NOLINT
    a_++;
    std::printf("test");
  }, (b_++, "other")), "Actual: test");
  EXPECT_EQ(2, a_);
  EXPECT_EQ(2, b_);
}